

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void single_channel_8_to_abgr_8888_le
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  byte *pbVar2;
  uint *puVar3;
  int iVar4;
  
  pbVar2 = (byte *)((long)src + (long)(sy * src_pitch) + (long)sx);
  puVar3 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  iVar4 = 0;
  if (height < 1) {
    height = iVar4;
  }
  for (; iVar4 != height; iVar4 = iVar4 + 1) {
    puVar1 = puVar3 + width;
    for (; puVar3 < puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = *pbVar2 | 0xff000000;
      pbVar2 = pbVar2 + 1;
    }
    pbVar2 = pbVar2 + (src_pitch - width);
    puVar3 = puVar3 + ((long)(dst_pitch / 4) - (long)width);
  }
  return;
}

Assistant:

static void single_channel_8_to_abgr_8888_le(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_SINGLE_CHANNEL_8_TO_ABGR_8888_LE(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}